

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<float> *original_costs,double cost_constant
            )

{
  local_context *ctx;
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  context *ctx_00;
  context *ctx_01;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long loop;
  bool bVar15;
  undefined1 auVar16 [16];
  float delta;
  float fVar17;
  float fVar18;
  float __y;
  float fVar19;
  undefined1 auVar22 [64];
  double dVar20;
  double dVar21;
  undefined1 extraout_var [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  float theta;
  undefined1 in_register_00001344 [12];
  compute_order compute;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  slv;
  float local_20c;
  optimize_functor<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
  *local_208;
  cost_type local_200;
  long local_1f0;
  bit_array_impl local_1e8;
  compute_order local_1d8;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  local_1a0;
  undefined1 extraout_var_00 [60];
  
  bit_array_impl::bit_array_impl(&local_1e8,variables);
  ctx_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  local_208 = this;
  normalize_costs<float,baryonyx::itm::default_cost_type<float>>
            ((itm *)&local_200,ctx_00,original_costs,&ctx->rng,variables);
  dVar20 = (ctx_00->parameters).kappa_step;
  dVar21 = (ctx_00->parameters).kappa_max;
  dVar2 = (ctx_00->parameters).alpha;
  dVar3 = (ctx_00->parameters).delta;
  theta = (float)(ctx_00->parameters).theta;
  if (0.0 <= dVar3) {
    delta = (float)dVar3;
  }
  else {
    ctx_01 = local_208->m_ctx;
    local_1a0.super_debug_logger<false>.ofs._0_4_ = theta;
    info<>(ctx_01,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar16 = SUB6416(ZEXT464(0x7f7fffff),0);
    }
    else {
      auVar22 = ZEXT464(0x7f7fffff);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      uVar13 = 0;
      do {
        pfVar1 = (float *)((long)local_200.linear_elements._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar13 * 4);
        uVar13 = uVar13 + 1;
        auVar5 = vandps_avx(ZEXT416((uint)*pfVar1),auVar24);
        uVar6 = vcmpps_avx512vl(ZEXT416((uint)*pfVar1),ZEXT816(0) << 0x40,4);
        uVar7 = vcmpps_avx512vl(auVar5,auVar22._0_16_,1);
        bVar8 = (byte)uVar6 & (byte)uVar7;
        auVar16._4_12_ = auVar22._4_12_;
        auVar16._0_4_ = (uint)(bVar8 & 1) * auVar5._0_4_ + (uint)!(bool)(bVar8 & 1) * auVar22._0_4_;
        auVar22 = ZEXT1664(auVar16);
      } while ((uint)variables != uVar13);
    }
    local_1d8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = auVar16._0_4_;
    auVar16 = vfnmadd132ss_fma(auVar16,auVar16,ZEXT416((uint)theta));
    local_20c = auVar16._0_4_;
    info<float,float,float>
              (ctx_01,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_20c,
               (float *)&local_1d8,(float *)&local_1a0);
    delta = local_20c;
  }
  local_1f0 = (long)(ctx_00->parameters).w;
  dVar3 = (ctx_00->parameters).pushing_k_factor;
  dVar4 = (ctx_00->parameters).pushing_objective_amplifier;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::solver_inequalities_Zcoeff
            (&local_1a0,&ctx->rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_200,constraints);
  compute_order::compute_order(&local_1d8,(ctx_00->parameters).order,variables);
  if (((stop_task->_M_base)._M_i & 1U) == 0) {
    fVar17 = (float)dVar20;
    bVar15 = false;
    fVar18 = (float)dVar21;
    __y = (float)dVar2;
    do {
      local_208->m_call_number = local_208->m_call_number + 1;
      dVar20 = best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
               ::reinit(best_recorder,ctx,bVar15,(ctx_00->parameters).kappa_min,
                        (ctx_00->parameters).kappa_max,(bit_array *)&local_1e8);
      compute_order::
      init<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array>
                (&local_1d8,&local_1a0,(bit_array *)&local_1e8);
      iVar14 = 0x7fffffff;
      if (((stop_task->_M_base)._M_i & 1U) == 0) {
        auVar22 = ZEXT1664(CONCAT124(in_register_00001344,(float)dVar20));
        loop = 0;
        while (loop != (ctx_00->parameters).limit) {
          fVar19 = auVar22._0_4_;
          iVar10 = compute_order::
                   run<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                             (&local_1d8,&local_1a0,(bit_array *)&local_1e8,&ctx->rng,fVar19,delta,
                              theta);
          if (iVar10 == 0) {
            dVar21 = default_cost_type<float>::results
                               (original_costs,(bit_array *)&local_1e8,cost_constant);
            best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
            ::try_update(best_recorder,ctx,(bit_array *)&local_1e8,dVar21,loop);
            bVar15 = true;
            goto LAB_0052c6ee;
          }
          if (iVar10 <= iVar14) {
            iVar14 = iVar10;
          }
          if (local_1f0 < loop) {
            auVar22._0_4_ = powf((float)iVar10 / (float)local_1a0.m,__y);
            auVar22._4_60_ = extraout_var;
            auVar16 = vfmadd231ss_fma(ZEXT416((uint)fVar19),auVar22._0_16_,ZEXT416((uint)fVar17));
            auVar22 = ZEXT1664(auVar16);
          }
          else {
            auVar22 = ZEXT464((uint)fVar19);
          }
          if ((fVar18 < auVar22._0_4_) || (loop = loop + 1, ((stop_task->_M_base)._M_i & 1U) != 0))
          break;
        }
        if (0 < iVar14) goto LAB_0052c690;
        bVar15 = false;
LAB_0052c6ee:
        if (((stop_task->_M_base)._M_i & 1U) == 0) {
          iVar14 = 0;
          iVar10 = 0;
          do {
            if ((ctx_00->parameters).pushes_limit <= iVar10) break;
            iVar11 = compute_order::
                     push_and_run<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                               (&local_1d8,&local_1a0,(bit_array *)&local_1e8,&ctx->rng,(float)dVar3
                                ,delta,theta,(float)dVar4);
            if (iVar11 == 0) {
              dVar21 = default_cost_type<float>::results
                                 (original_costs,(bit_array *)&local_1e8,cost_constant);
              best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
              ::try_update(best_recorder,ctx,(bit_array *)&local_1e8,dVar21,
                           (long)~((ctx_00->parameters).pushing_iteration_limit * iVar10));
              bVar15 = true;
            }
            if (((stop_task->_M_base)._M_i & 1U) == 0) {
              auVar22 = ZEXT464((uint)(float)dVar20);
              iVar11 = 1;
              while (iVar11 + -1 < (ctx_00->parameters).pushing_iteration_limit) {
                fVar19 = auVar22._0_4_;
                iVar12 = compute_order::
                         run<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                                   (&local_1d8,&local_1a0,(bit_array *)&local_1e8,&ctx->rng,fVar19,
                                    delta,theta);
                if (iVar12 == 0) {
                  dVar21 = default_cost_type<float>::results
                                     (original_costs,(bit_array *)&local_1e8,cost_constant);
                  best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
                  ::try_update(best_recorder,ctx,(bit_array *)&local_1e8,dVar21,
                               (long)((ctx_00->parameters).pushing_iteration_limit * iVar14 - iVar11
                                     ));
                  bVar15 = true;
                  break;
                }
                if ((double)(iVar11 + -1) <= (ctx_00->parameters).w) {
                  auVar22 = ZEXT464((uint)fVar19);
                }
                else {
                  auVar23._0_4_ = powf((float)iVar12 / (float)local_1a0.m,__y);
                  auVar23._4_60_ = extraout_var_00;
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)fVar19),auVar23._0_16_,
                                            ZEXT416((uint)fVar17));
                  auVar22 = ZEXT1664(auVar16);
                }
                if ((fVar18 < auVar22._0_4_) ||
                   (iVar11 = iVar11 + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
              }
            }
            iVar10 = iVar10 + 1;
            iVar14 = iVar14 + -1;
          } while (((stop_task->_M_base)._M_i & 1U) == 0);
        }
      }
      else {
LAB_0052c690:
        best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
        ::try_advance(best_recorder,ctx,(bit_array *)&local_1e8,iVar14,(ctx_00->parameters).limit);
        bVar15 = false;
      }
    } while (((stop_task->_M_base)._M_i & 1U) == 0);
  }
  if (local_1d8.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar9 = (void *)CONCAT44(local_1d8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_1d8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,(long)local_1d8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar9);
  }
  solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::~solver_inequalities_Zcoeff(&local_1a0);
  if ((_Head_base<0UL,_float_*,_false>)
      local_200.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0) {
    operator_delete__((void *)local_200.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if (local_1e8.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_1e8.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }